

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neverbleed.c
# Opt level: O0

void * daemon_conn_thread(void *_sock_fd)

{
  int fd;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  char *cmd;
  uchar auth_token [32];
  expbuf_t buf;
  int sock_fd;
  void *_sock_fd_local;
  
  fd = (int)_sock_fd;
  memset(auth_token + 0x18,0,0x20);
  iVar1 = read_nbytes(fd,&cmd,0x20);
  if (iVar1 == 0) {
    iVar1 = memcmp(&cmd,(daemon_vars.nb)->auth_token,0x20);
    if (iVar1 == 0) {
      while (iVar1 = expbuf_read((expbuf_t *)(auth_token + 0x18),fd), iVar1 == 0) {
        pcVar3 = expbuf_shift_str((expbuf_t *)(auth_token + 0x18));
        if (pcVar3 == (char *)0x0) {
          piVar2 = __errno_location();
          *piVar2 = 0;
          warnf("failed to parse request");
          goto LAB_00203e69;
        }
        iVar1 = strcmp(pcVar3,"priv_enc");
        if (iVar1 == 0) {
          iVar1 = priv_enc_stub((expbuf_t *)(auth_token + 0x18));
        }
        else {
          iVar1 = strcmp(pcVar3,"priv_dec");
          if (iVar1 == 0) {
            iVar1 = priv_dec_stub((expbuf_t *)(auth_token + 0x18));
          }
          else {
            iVar1 = strcmp(pcVar3,"sign");
            if (iVar1 == 0) {
              iVar1 = sign_stub((expbuf_t *)(auth_token + 0x18));
            }
            else {
              iVar1 = strcmp(pcVar3,"ecdsa_sign");
              if (iVar1 == 0) {
                iVar1 = ecdsa_sign_stub((expbuf_t *)(auth_token + 0x18));
              }
              else {
                iVar1 = strcmp(pcVar3,"del_ecdsa_key");
                if (iVar1 == 0) {
                  iVar1 = del_ecdsa_key_stub((expbuf_t *)(auth_token + 0x18));
                }
                else {
                  iVar1 = strcmp(pcVar3,"load_key");
                  if (iVar1 == 0) {
                    iVar1 = load_key_stub((expbuf_t *)(auth_token + 0x18));
                  }
                  else {
                    iVar1 = strcmp(pcVar3,"del_rsa_key");
                    if (iVar1 == 0) {
                      iVar1 = del_rsa_key_stub((expbuf_t *)(auth_token + 0x18));
                    }
                    else {
                      iVar1 = strcmp(pcVar3,"setuidgid");
                      if (iVar1 != 0) {
                        warnf("unknown command:%s",pcVar3);
                        goto LAB_00203e69;
                      }
                      iVar1 = setuidgid_stub((expbuf_t *)(auth_token + 0x18));
                    }
                  }
                }
              }
            }
          }
        }
        if (iVar1 != 0) goto LAB_00203e69;
        iVar1 = expbuf_write((expbuf_t *)(auth_token + 0x18),fd);
        if (iVar1 != 0) {
          piVar2 = __errno_location();
          pcVar3 = "connection closed by client";
          if (*piVar2 != 0) {
            pcVar3 = "write error";
          }
          warnf(pcVar3);
          goto LAB_00203e69;
        }
        expbuf_dispose((expbuf_t *)(auth_token + 0x18));
      }
      piVar2 = __errno_location();
      if (*piVar2 != 0) {
        warnf("read error");
      }
    }
    else {
      warnf("client authentication failed");
    }
  }
  else {
    warnf("failed to receive authencication token from client");
  }
LAB_00203e69:
  expbuf_dispose((expbuf_t *)(auth_token + 0x18));
  close(fd);
  return (void *)0x0;
}

Assistant:

static void *daemon_conn_thread(void *_sock_fd)
{
    int sock_fd = (int)((char *)_sock_fd - (char *)NULL);
    struct expbuf_t buf = {NULL};
    unsigned char auth_token[NEVERBLEED_AUTH_TOKEN_SIZE];

    /* authenticate */
    if (read_nbytes(sock_fd, &auth_token, sizeof(auth_token)) != 0) {
        warnf("failed to receive authencication token from client");
        goto Exit;
    }
    if (memcmp(auth_token, daemon_vars.nb->auth_token, NEVERBLEED_AUTH_TOKEN_SIZE) != 0) {
        warnf("client authentication failed");
        goto Exit;
    }

    while (1) {
        char *cmd;
        if (expbuf_read(&buf, sock_fd) != 0) {
            if (errno != 0)
                warnf("read error");
            break;
        }
        if ((cmd = expbuf_shift_str(&buf)) == NULL) {
            errno = 0;
            warnf("failed to parse request");
            break;
        }
        if (strcmp(cmd, "priv_enc") == 0) {
            if (priv_enc_stub(&buf) != 0)
                break;
        } else if (strcmp(cmd, "priv_dec") == 0) {
            if (priv_dec_stub(&buf) != 0)
                break;
        } else if (strcmp(cmd, "sign") == 0) {
            if (sign_stub(&buf) != 0)
                break;
#if OPENSSL_1_1_API
        } else if (strcmp(cmd, "ecdsa_sign") == 0) {
            if (ecdsa_sign_stub(&buf) != 0)
                break;
        } else if (strcmp(cmd, "del_ecdsa_key") == 0) {
            if (del_ecdsa_key_stub(&buf) != 0)
                break;
#endif
        } else if (strcmp(cmd, "load_key") == 0) {
            if (load_key_stub(&buf) != 0)
                break;
        } else if (strcmp(cmd, "del_rsa_key") == 0) {
            if (del_rsa_key_stub(&buf) != 0)
                break;
        } else if (strcmp(cmd, "setuidgid") == 0) {
            if (setuidgid_stub(&buf) != 0)
                break;
        } else {
            warnf("unknown command:%s", cmd);
            break;
        }
        if (expbuf_write(&buf, sock_fd) != 0) {
            warnf(errno != 0 ? "write error" : "connection closed by client");
            break;
        }
        expbuf_dispose(&buf);
    }

Exit:
    expbuf_dispose(&buf);
    close(sock_fd);

    return NULL;
}